

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomrestartmethod.cpp
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
randomRestartMethod::optimize
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,randomRestartMethod *this)

{
  allocator<double> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  backtrackingLineSearch *pbVar1;
  initializer_list<double> __l;
  result_type rVar2;
  reference pvVar3;
  ostream *poVar4;
  vector<double,_std::allocator<double>_> local_2860;
  vector<double,_std::allocator<double>_> local_2848;
  string local_2830;
  string local_2810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_27f0;
  undefined1 local_27d0 [8];
  string logFileName;
  vector<double,_std::allocator<double>_> x_opt;
  result_type_conflict1 local_2790;
  result_type_conflict1 local_2788;
  iterator local_2780;
  size_type local_2778;
  undefined1 local_2770 [8];
  vector<double,_std::allocator<double>_> x;
  undefined1 local_2750 [4];
  uint i;
  uniform_real_distribution<double> dis;
  mt19937 gen;
  undefined1 local_13a8 [8];
  random_device rd;
  randomRestartMethod *this_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *opt_count;
  
  rd.field_0._M_mt._M_p._7_1_ = 0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__);
  std::random_device::random_device((random_device *)local_13a8);
  rVar2 = std::random_device::operator()((random_device *)local_13a8);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&dis._M_param._M_b,(ulong)rVar2);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)local_2750,this->from,this->to);
  for (x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ <= this->no_restarts;
      x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    local_2790 = std::uniform_real_distribution<double>::operator()
                           ((uniform_real_distribution<double> *)local_2750,
                            (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)&dis._M_param._M_b);
    local_2788 = std::uniform_real_distribution<double>::operator()
                           ((uniform_real_distribution<double> *)local_2750,
                            (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)&dis._M_param._M_b);
    local_2780 = &local_2790;
    local_2778 = 2;
    this_00 = (allocator<double> *)
              ((long)&x_opt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(this_00);
    __l._M_len = local_2778;
    __l._M_array = local_2780;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_2770,__l,this_00);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&x_opt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)((long)&logFileName.field_2 + 8));
    if ((this->super_optimizer).verbose != 0) {
      std::__cxx11::to_string
                (&local_2810,
                 x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_);
      std::operator+(&local_27f0,"../logs/solutionPath",&local_2810);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_27d0
                     ,&local_27f0,".dat");
      std::__cxx11::string::~string((string *)&local_27f0);
      std::__cxx11::string::~string((string *)&local_2810);
      pbVar1 = this->unconstraint_optimizer;
      std::__cxx11::string::string((string *)&local_2830,(string *)local_27d0);
      optimizer::setLogFileName(&pbVar1->super_optimizer,&local_2830);
      std::__cxx11::string::~string((string *)&local_2830);
      optimizer::setVerbose
                (&this->unconstraint_optimizer->super_optimizer,(this->super_optimizer).verbose);
      std::__cxx11::string::~string((string *)local_27d0);
    }
    pbVar1 = this->unconstraint_optimizer;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_2848,(vector<double,_std::allocator<double>_> *)local_2770);
    backtrackingLineSearch::set_x0(pbVar1,&local_2848);
    std::vector<double,_std::allocator<double>_>::~vector(&local_2848);
    backtrackingLineSearch::optimize(&local_2860,this->unconstraint_optimizer);
    this_01 = (vector<double,_std::allocator<double>_> *)((long)&logFileName.field_2 + 8);
    std::vector<double,_std::allocator<double>_>::operator=(this_01,&local_2860);
    std::vector<double,_std::allocator<double>_>::~vector(&local_2860);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_01,0);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar3);
    poVar4 = std::operator<<(poVar4," ");
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)((long)&logFileName.field_2 + 8),
                        1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_ + 1);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)((long)&logFileName.field_2 + 8));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_2770);
  }
  if ((this->super_optimizer).verbose == 2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Plotting the solutions");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    system("gnuplot -p -e \'load \"../logs/solutionPath.plt\"\'");
  }
  rd.field_0._M_mt._M_p._7_1_ = 1;
  std::random_device::~random_device((random_device *)local_13a8);
  if ((rd.field_0._M_mt._M_p._7_1_ & 1) == 0) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<double>>  randomRestartMethod::optimize(){
    vector<vector<double>> opt_count;
    random_device rd;
    std::mt19937 gen(rd()); //Standard mersenne_twister_engine seeded with rd()
    std::uniform_real_distribution<> dis(from,to);

    for(uint i=0;i<=no_restarts;i++){
        vector<double> x={dis(gen),dis(gen)};
        vector<double> x_opt;
        if(verbose!=0){
            string logFileName="../logs/solutionPath"+to_string(i)+".dat";
            unconstraint_optimizer->setLogFileName(logFileName);
            unconstraint_optimizer->setVerbose(verbose);
        }
        unconstraint_optimizer->set_x0(x);
        x_opt=unconstraint_optimizer->optimize();
        cout<<x_opt[0]<<" "<<x_opt[1]<<" "<<(i+1)<<endl;
    }
    if (verbose == 2){
        std::cout<<"Plotting the solutions"<<std::endl;
        system("gnuplot -p -e 'load \"../logs/solutionPath.plt\"'");
    }
    return opt_count;
}